

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O1

clip_image_size llava_uhd::get_best_grid(int max_slice_nums,int multiple,float log_ratio)

{
  uint uVar1;
  double dVar2;
  pointer pcVar3;
  clip_image_size cVar4;
  uint uVar5;
  long lVar6;
  clip_image_size *grid;
  pointer pcVar7;
  uint *puVar8;
  bool bVar9;
  float fVar10;
  int i;
  vector<clip_image_size,_std::allocator<clip_image_size>_> candidate_grids;
  vector<int,_std::allocator<int>_> candidate_split_grids_nums;
  clip_image_size local_80;
  vector<clip_image_size,_std::allocator<clip_image_size>_> local_78;
  double local_58;
  uint *local_50;
  uint *local_48;
  iterator iStack_40;
  int *local_38;
  
  local_58 = (double)CONCAT44(local_58._4_4_,log_ratio);
  local_48 = (uint *)0x0;
  iStack_40._M_current = (int *)0x0;
  local_38 = (int *)0x0;
  local_78.super__Vector_base<clip_image_size,_std::allocator<clip_image_size>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)CONCAT44(multiple,multiple + -1);
  local_78.super__Vector_base<clip_image_size,_std::allocator<clip_image_size>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(local_78.
                         super__Vector_base<clip_image_size,_std::allocator<clip_image_size>_>.
                         _M_impl.super__Vector_impl_data._M_finish._4_4_,multiple + 1);
  lVar6 = 0;
  do {
    local_80.width =
         *(uint *)((long)&local_78.
                          super__Vector_base<clip_image_size,_std::allocator<clip_image_size>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar6);
    if (local_80.width <= max_slice_nums && local_80.width != 1) {
      if (iStack_40._M_current == local_38) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_48,iStack_40,&local_80.width);
      }
      else {
        *iStack_40._M_current = local_80.width;
        iStack_40._M_current = iStack_40._M_current + 1;
      }
    }
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0xc);
  local_78.super__Vector_base<clip_image_size,_std::allocator<clip_image_size>_>._M_impl.
  super__Vector_impl_data._M_start = (clip_image_size *)0x0;
  local_78.super__Vector_base<clip_image_size,_std::allocator<clip_image_size>_>._M_impl.
  super__Vector_impl_data._M_finish = (clip_image_size *)0x0;
  local_78.super__Vector_base<clip_image_size,_std::allocator<clip_image_size>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = (uint *)iStack_40._M_current;
  if (local_48 != (uint *)iStack_40._M_current) {
    puVar8 = local_48;
    do {
      uVar1 = *puVar8;
      if (0 < (int)uVar1) {
        uVar5 = 1;
        do {
          if (uVar1 % uVar5 == 0) {
            local_80.width = uVar5;
            local_80.height = uVar1 / uVar5;
            std::vector<clip_image_size,_std::allocator<clip_image_size>_>::
            emplace_back<clip_image_size>(&local_78,&local_80);
          }
          bVar9 = uVar5 != uVar1;
          uVar5 = uVar5 + 1;
        } while (bVar9);
      }
      puVar8 = puVar8 + 1;
    } while (puVar8 != local_50);
  }
  pcVar3 = local_78.super__Vector_base<clip_image_size,_std::allocator<clip_image_size>_>._M_impl.
           super__Vector_impl_data._M_finish;
  cVar4.width = 1;
  cVar4.height = 1;
  if (local_78.super__Vector_base<clip_image_size,_std::allocator<clip_image_size>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_78.super__Vector_base<clip_image_size,_std::allocator<clip_image_size>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_58 = (double)local_58._0_4_;
    fVar10 = INFINITY;
    pcVar7 = local_78.super__Vector_base<clip_image_size,_std::allocator<clip_image_size>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_50 = (uint *)CONCAT44(local_50._4_4_,fVar10);
      dVar2 = log((double)(*pcVar7).width / (double)(*pcVar7).height);
      fVar10 = local_50._0_4_;
      if (ABS((float)(local_58 - dVar2)) < local_50._0_4_) {
        cVar4 = *pcVar7;
        fVar10 = ABS((float)(local_58 - dVar2));
      }
      pcVar7 = pcVar7 + 1;
    } while (pcVar7 != pcVar3);
  }
  if (local_78.super__Vector_base<clip_image_size,_std::allocator<clip_image_size>_>._M_impl.
      super__Vector_impl_data._M_start != (clip_image_size *)0x0) {
    operator_delete(local_78.super__Vector_base<clip_image_size,_std::allocator<clip_image_size>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<clip_image_size,_std::allocator<clip_image_size>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<clip_image_size,_std::allocator<clip_image_size>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48 != (uint *)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  return cVar4;
}

Assistant:

static clip_image_size get_best_grid(const int max_slice_nums, const int multiple, const float log_ratio) {
        std::vector<int> candidate_split_grids_nums;
        for (int i : {multiple - 1, multiple, multiple + 1}) {
            if (i == 1 || i > max_slice_nums) {
                continue;
            }
            candidate_split_grids_nums.push_back(i);
        }

        std::vector<clip_image_size> candidate_grids;
        for (int split_grids_nums : candidate_split_grids_nums) {
            int m = 1;
            while (m <= split_grids_nums) {
                if (split_grids_nums % m == 0) {
                    candidate_grids.push_back(clip_image_size{m, split_grids_nums / m});
                }
                ++m;
            }
        }

        clip_image_size best_grid{1, 1};
        float min_error = std::numeric_limits<float>::infinity();
        for (const auto& grid : candidate_grids) {
            float error = std::abs(log_ratio - std::log(1.0 * grid.width / grid.height));
            if (error < min_error) {
                best_grid = grid;
                min_error = error;
            }
        }
        return best_grid;
    }